

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadrb.c
# Opt level: O0

int dParseIntFormat(char *buf,int *num,int *size)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *local_28;
  char *tmp;
  int *size_local;
  int *num_local;
  char *buf_local;
  
  local_28 = buf;
  do {
    pcVar2 = local_28 + 1;
    cVar1 = *local_28;
    local_28 = pcVar2;
  } while (cVar1 != '(');
  __isoc99_sscanf(pcVar2,"%d",num);
  while( true ) {
    bVar3 = false;
    if (*local_28 != 'I') {
      bVar3 = *local_28 != 'i';
    }
    if (!bVar3) break;
    local_28 = local_28 + 1;
  }
  __isoc99_sscanf(local_28 + 1,"%d",size);
  return 0;
}

Assistant:

static int dParseIntFormat(char *buf, int *num, int *size)
{
    char *tmp;

    tmp = buf;
    while (*tmp++ != '(') ;
    sscanf(tmp, "%d", num);
    while (*tmp != 'I' && *tmp != 'i') ++tmp;
    ++tmp;
    sscanf(tmp, "%d", size);
    return 0;
}